

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test::
TestBody(CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test *this)

{
  DescriptorPool *spec;
  FeatureSet *pFVar1;
  uint uVar2;
  MessageLite *pMVar3;
  ulong uVar4;
  pointer *__ptr;
  AssertHelper *this_00;
  FeatureSetDefaults *this_01;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr_2;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  string_view schema;
  Metadata MVar6;
  FileDescriptor *file;
  TestGenerator generator;
  AssertHelper local_168;
  undefined1 local_160 [8];
  __uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined1 local_140 [8];
  undefined1 local_138 [8];
  FeatureSetDefaults local_130;
  AssertHelper local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [24];
  CodeGenerator local_c8 [2];
  undefined8 local_b8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_b0;
  FeatureSetDefaults local_98;
  FeatureSetDefaults local_60;
  
  this_00 = &local_168;
  local_c8[0]._vptr_CodeGenerator = (_func_int **)&PTR__TestGenerator_018c7208;
  local_c8[1]._vptr_CodeGenerator = (_func_int **)0x2;
  local_b8 = 0x3e8000003e6;
  local_138 = (undefined1  [8])
              GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                        ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                          *)&pb::test);
  __l._M_len = 1;
  __l._M_array = (iterator)(local_140 + 8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_b0,__l,(allocator_type *)local_160);
  local_138 = (undefined1  [8])
              GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                        ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                          *)&pb::test);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_140 + 8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_e0,__l_00,(allocator_type *)local_160);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::operator=(&local_b0,
              (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_e0);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
  }
  CodeGenerator::BuildFeatureSetDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)(local_140 + 8),local_c8);
  if (local_138 != (undefined1  [8])0x1) {
    absl::lts_20250127::internal_statusor::Helper::Crash((Status *)(local_140 + 8));
  }
  spec = &(this->super_CodeGeneratorTest).pool_;
  FeatureSetDefaults::FeatureSetDefaults(&local_60,(Arena *)0x0,&local_130);
  DescriptorPool::SetFeatureSetDefaults((DescriptorPool *)local_160,(FeatureSetDefaults *)spec);
  local_f8.data_._0_1_ = local_160 == (undefined1  [8])0x1;
  local_f0._0_8_ = (FeatureSetDefaults *)0x0;
  if (((ulong)local_160 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_160);
  }
  this_01 = (FeatureSetDefaults *)local_f0;
  FeatureSetDefaults::~FeatureSetDefaults(&local_60);
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)(local_140 + 8));
  if (local_f8.data_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_168);
    CodeGenerator::BuildFeatureSetDefaults
              ((StatusOr<google::protobuf::FeatureSetDefaults> *)(local_140 + 8),local_c8);
    if ((_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
         )local_138 !=
        (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)0x1) {
      absl::lts_20250127::internal_statusor::Helper::Crash((Status *)(local_140 + 8));
    }
    FeatureSetDefaults::FeatureSetDefaults(&local_98,(Arena *)0x0,&local_130);
    DescriptorPool::SetFeatureSetDefaults((DescriptorPool *)local_140,(FeatureSetDefaults *)spec);
    if (((ulong)local_140 & 1) == 0) {
      pcVar5 = (((string *)((long)local_140 + 8))->_M_dataplus)._M_p;
      uVar4 = *(size_type *)((long)local_140 + 0x10);
    }
    else {
      uVar4 = (ulong)((uint)(((long)local_140 << 0x3e) >> 0x3f) & 0x1b);
      pcVar5 = (char *)(((long)local_140 << 0x3e) >> 0x3f & 0x10e15d0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 0x10),pcVar5,
               uVar4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)&local_f8,
               (AssertionResult *)
               "pool_.SetFeatureSetDefaults(*generator.BuildFeatureSetDefaults()).ok()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_f0 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
               ,0xae,(char *)local_160);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_f0 + 8),(Message *)&local_168)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_f0 + 8));
    if (local_160 != (undefined1  [8])&local_150) {
      operator_delete((void *)local_160,(ulong)(local_150._M_allocated_capacity + 1));
    }
    if (((ulong)local_140 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_140);
    }
    FeatureSetDefaults::~FeatureSetDefaults(&local_98);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)(local_140 + 8));
    if ((long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 8))();
    }
    local_130.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)local_f0._0_8_;
    if ((FeatureSetDefaults *)local_f0._0_8_ == (FeatureSetDefaults *)0x0) goto LAB_009f44cb;
  }
  else {
    if ((FeatureSetDefaults *)local_f0._0_8_ != (FeatureSetDefaults *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_f0._0_8_);
    }
    MVar6 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
    local_160 = (undefined1  [8])
                CodeGeneratorTest::BuildFile
                          (&this->super_CodeGeneratorTest,(MVar6.descriptor)->file_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>::
    operator()(local_140 + 8,(char *)&local_f8,
               (FileDescriptor **)"BuildFile(DescriptorProto::descriptor()->file())");
    if (local_138[0] == '\0') {
      testing::Message::Message((Message *)local_160);
      if ((__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
           )local_130.super_Message.super_MessageLite._vptr_MessageLite ==
          (__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
           )0x0) {
        pcVar5 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                 ,0xb0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_160);
LAB_009f449d:
      this_00 = &local_f8;
LAB_009f44a2:
      testing::internal::AssertHelper::~AssertHelper(this_00);
      if (local_160 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_160 + 8))();
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      MVar6 = pb::TestMessage::GetMetadata((TestMessage *)pb::_TestMessage_default_instance_);
      local_160 = (undefined1  [8])
                  CodeGeneratorTest::BuildFile
                            (&this->super_CodeGeneratorTest,(MVar6.descriptor)->file_);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_140 + 8,(char *)&local_f8,
                   (FileDescriptor **)"BuildFile(pb::TestMessage::descriptor()->file())");
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xb1,pcVar5);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_160);
        goto LAB_009f449d;
      }
      if ((AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      schema._M_str =
           "\n    edition = \"2023\";\n    package proto2_unittest;\n\n    import \"google/protobuf/unittest_features.proto\";\n\n    option features.field_presence = EXPLICIT;  // 2023 default\n    option features.enum_type = CLOSED;         // override\n    option features.(pb.test).file_feature = VALUE6;\n    option features.(pb.test).source_feature = VALUE5;\n  "
      ;
      schema._M_len = 0x156;
      local_f8.data_ =
           (AssertHelperData *)CodeGeneratorTest::BuildFile(&this->super_CodeGeneratorTest,schema);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_140 + 8,local_160,(FileDescriptor **)0x124f7be);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((_Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
             )local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xbd,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        goto LAB_009f44a2;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      pFVar1 = *(FeatureSet **)((long)local_f8.data_ + 0x90);
      pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pFVar1->field_0)._impl_._extensions_,pb::test,
                          (MessageLite *)PTR__TestFeatures_default_instance__01970360);
      uVar2 = (pFVar1->field_0)._impl_._has_bits_.has_bits_[0] & 4;
      local_158._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
      ._M_head_impl =
           (tuple<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
            )(_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
              )0x0;
      if (uVar2 == 0) {
        local_160[0] = SUB41(uVar2 >> 2,0);
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_140 + 8),(internal *)local_160,
                   (AssertionResult *)"features.has_repeated_field_encoding()","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xc2,(char *)local_138);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_140,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_140);
        if (local_138 !=
            (undefined1  [8])&local_130.super_Message.super_MessageLite._internal_metadata_) {
          operator_delete((void *)local_138,
                          local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ + 1);
        }
        if ((long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 8))();
        }
        if ((_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
             )local_158._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
              ._M_head_impl !=
            (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
             *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                       ._M_head_impl);
        }
      }
      local_160[0] = (allocator_type)((pFVar1->field_0)._impl_.field_presence_ != 0);
      local_158._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
      ._M_head_impl =
           (tuple<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
            )(_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
              )0x0;
      if (!(bool)local_160[0]) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_140 + 8),(internal *)local_160,
                   (AssertionResult *)"features.field_presence()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xc3,(char *)local_138);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_140,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_140);
        if (local_138 !=
            (undefined1  [8])&local_130.super_Message.super_MessageLite._internal_metadata_) {
          operator_delete((void *)local_138,
                          local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ + 1);
        }
        if ((long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 8))();
        }
        if (local_158._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
             )0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                       ._M_head_impl);
        }
      }
      local_160._0_4_ = (pFVar1->field_0)._impl_.field_presence_;
      testing::internal::
      CmpHelperEQ<google::protobuf::FeatureSet_FieldPresence,google::protobuf::FeatureSet_FieldPresence>
                ((internal *)(local_140 + 8),"features.field_presence()","FeatureSet::EXPLICIT",
                 (FeatureSet_FieldPresence *)local_160,&FeatureSet::EXPLICIT);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xc4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_160 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_160 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      local_160._0_4_ = (pFVar1->field_0)._impl_.enum_type_;
      testing::internal::
      CmpHelperEQ<google::protobuf::FeatureSet_EnumType,google::protobuf::FeatureSet_EnumType>
                ((internal *)(local_140 + 8),"features.enum_type()","FeatureSet::CLOSED",
                 (FeatureSet_EnumType *)local_160,&FeatureSet::CLOSED);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xc5,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_160 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_160 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      local_160._0_4_ = (int)pMVar3[1]._internal_metadata_.ptr_;
      local_168.data_._0_4_ = 6;
      testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                ((internal *)(local_140 + 8),"ext.file_feature()","pb::EnumFeature::VALUE6",
                 (EnumFeature *)local_160,(EnumFeature *)&local_168);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
             )local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
             )0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,199,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_160 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_160 + 8))();
        }
      }
      if ((AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      local_160._0_4_ = *(undefined4 *)((long)&pMVar3[4]._vptr_MessageLite + 4);
      local_168.data_._0_4_ = 5;
      testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                ((internal *)(local_140 + 8),"ext.source_feature()","pb::EnumFeature::VALUE5",
                 (EnumFeature *)local_160,(EnumFeature *)&local_168);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
             )local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (__uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
             )0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,200,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_160 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_160 + 8))();
        }
      }
      if ((AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)
          local_130.super_Message.super_MessageLite._vptr_MessageLite !=
          (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.super_Message.super_MessageLite._vptr_MessageLite);
      }
      local_160._0_4_ = *(undefined4 *)((long)&pMVar3[2]._vptr_MessageLite + 4);
      local_168.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                ((internal *)(local_140 + 8),"ext.field_feature()","pb::EnumFeature::VALUE1",
                 (EnumFeature *)local_160,(EnumFeature *)&local_168);
      if (local_138[0] == '\0') {
        testing::Message::Message((Message *)local_160);
        if ((AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)
            local_130.super_Message.super_MessageLite._vptr_MessageLite ==
            (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (char *)*local_130.super_Message.super_MessageLite._vptr_MessageLite;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/code_generator_unittest.cc"
                   ,0xc9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)local_160);
        this_00 = &local_168;
        goto LAB_009f44a2;
      }
    }
    if ((tuple<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
         )local_130.super_Message.super_MessageLite._vptr_MessageLite ==
        (_Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
         )0x0) goto LAB_009f44cb;
    this_01 = &local_130;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_130.super_Message.super_MessageLite._vptr_MessageLite);
LAB_009f44cb:
  local_c8[0]._vptr_CodeGenerator = (_func_int **)&PTR__TestGenerator_018c7208;
  if (local_b0.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  CodeGenerator::~CodeGenerator(local_c8);
  return;
}

Assistant:

TEST_F(CodeGeneratorTest, GetResolvedSourceFeaturesRoot) {
  TestGenerator generator;
  generator.set_feature_extensions({GetExtensionReflection(pb::test)});
  ASSERT_OK(pool_.SetFeatureSetDefaults(*generator.BuildFeatureSetDefaults()));

  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.field_presence = EXPLICIT;  // 2023 default
    option features.enum_type = CLOSED;         // override
    option features.(pb.test).file_feature = VALUE6;
    option features.(pb.test).source_feature = VALUE5;
  )schema");
  ASSERT_THAT(file, NotNull());

  const FeatureSet& features = TestGenerator::GetResolvedSourceFeatures(*file);
  const pb::TestFeatures& ext = features.GetExtension(pb::test);

  EXPECT_TRUE(features.has_repeated_field_encoding());
  EXPECT_TRUE(features.field_presence());
  EXPECT_EQ(features.field_presence(), FeatureSet::EXPLICIT);
  EXPECT_EQ(features.enum_type(), FeatureSet::CLOSED);

  EXPECT_EQ(ext.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext.source_feature(), pb::EnumFeature::VALUE5);
  EXPECT_EQ(ext.field_feature(), pb::EnumFeature::VALUE1);
}